

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O3

double * __thiscall google::protobuf::Map<long,_double>::at(Map<long,_double> *this,key_type *key)

{
  LogMessage *other;
  LogFinisher local_49;
  LogMessage local_48;
  
  InnerMap::FindHelper
            ((pair<google::protobuf::Map<long,_double>::InnerMap::iterator_base<const_google::protobuf::Map<long,_double>::KeyValuePair>,_unsigned_long>
              *)&local_48,this->elements_,key,(TreeIterator *)0x0);
  if (local_48._0_8_ == 0) {
    internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/map.h"
               ,0x418);
    other = internal::LogMessage::operator<<(&local_48,"CHECK failed: it != end(): ");
    internal::LogFinisher::operator=(&local_49,other);
    internal::LogMessage::~LogMessage(&local_48);
  }
  return (double *)(*(long *)(local_48._0_8_ + 8) + 8);
}

Assistant:

const T& at(const key_type& key) const {
    const_iterator it = find(key);
    GOOGLE_CHECK(it != end());
    return it->second;
  }